

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

string * __thiscall
slang::CommandLine::addIgnoreCommand_abi_cxx11_
          (string *__return_storage_ptr__,CommandLine *this,string_view value)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  void *pvVar3;
  ulong uVar4;
  optional<int> oVar6;
  _Storage<int,_true> *p_Var7;
  size_type *psVar8;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  size_t __n_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __n;
  ulong uVar10;
  string_view value_00;
  string_view fmt;
  format_args args;
  string local_78;
  key_type local_50;
  size_t sVar5;
  
  __s = value._M_str;
  __n_00 = value._M_len;
  uVar10 = 0xffffffffffffffff;
  if (__n_00 == 0) {
LAB_002ae909:
    uVar4 = 0xffffffffffffffff;
  }
  else {
    pvVar3 = memchr(__s,0x2c,__n_00);
    uVar10 = -(ulong)(pvVar3 == (void *)0x0) | (long)pvVar3 - (long)__s;
    sVar5 = __n_00;
    do {
      uVar4 = sVar5 - 1;
      if (sVar5 == 0) goto LAB_002ae909;
      lVar1 = sVar5 - 1;
      sVar5 = uVar4;
    } while (__s[lVar1] != ',');
  }
  if (uVar10 == 0xffffffffffffffff || uVar10 != uVar4) {
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x27;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_78;
    local_78._M_dataplus._M_p = __s;
    local_78._M_string_length = __n_00;
    ::fmt::v11::vformat_abi_cxx11_
              (__return_storage_ptr__,(v11 *)"missing or extra comma in argument \'{}\'",fmt,args);
  }
  else {
    lVar1 = uVar10 + 1;
    if (__n_00 <= uVar10) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,__n_00);
    }
    value_00._M_str = __s + lVar1;
    paVar2 = &local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    value_00._M_len = __n_00 - lVar1;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    oVar6 = parseInt<int>((string_view)(ZEXT816(0x4ffe75) << 0x40),value_00,&local_78);
    if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_78.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_78._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0])
        ;
      }
      psVar8 = &local_78._M_string_length;
      __return_storage_ptr__->_M_string_length = local_78._M_string_length;
      paVar9 = paVar2;
      local_78._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + uVar10);
      p_Var7 = (_Storage<int,_true> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->cmdIgnore,&local_50);
      p_Var7->_M_value =
           oVar6.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
           _M_payload;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar9;
      psVar8 = &__return_storage_ptr__->_M_string_length;
    }
    *psVar8 = 0;
    paVar9->_M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::addIgnoreCommand(std::string_view value) {
    const size_t firstCommaIndex = value.find_first_of(',');
    const size_t lastCommaIndex = value.find_last_of(',');
    if (firstCommaIndex == std::string_view::npos || firstCommaIndex != lastCommaIndex)
        return fmt::format("missing or extra comma in argument '{}'", value);

    const std::string_view numArgs = value.substr(firstCommaIndex + 1);
    value = value.substr(0, firstCommaIndex);

    std::string error;
    auto result = parseInt<int>("", numArgs, error);
    if (result) {
        cmdIgnore[std::string(value)] = *result;
        return {};
    }
    return error;
}